

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAMCoupe.cpp
# Opt level: O0

bool IsBDOSDisk(HDD *hdd,BDOS_CAPS *bdc)

{
  bool bVar1;
  byte bVar2;
  uint8_t *puVar3;
  int *piVar4;
  byte local_b9;
  int local_64;
  undefined1 auStack_60 [4];
  int i;
  BDOS_CAPS bdcLBA;
  undefined1 local_40 [8];
  MEMORY mem;
  bool f;
  BDOS_CAPS *bdc_local;
  HDD *hdd_local;
  
  mem.pb._7_1_ = 0;
  if (hdd->sector_size == 0x200) {
    MEMORY::MEMORY((MEMORY *)local_40,hdd->sector_size);
    GetBDOSCaps((long)(hdd->cyls * hdd->heads * hdd->sectors),bdc);
    bVar1 = ReadSector(hdd,bdc->base_sectors,(MEMORY *)local_40);
    if (bVar1) {
      puVar3 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_40);
      bVar2 = *(int *)(puVar3 + 0xe8) != 0x4f534244 ^ 0xff;
      bdc->need_byteswap = (bool)(bVar2 & 1);
      mem.pb._7_1_ = bVar2 & 1;
      if (mem.pb._7_1_ == 0) {
        puVar3 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_40);
        mem.pb._7_1_ = (*(int *)(puVar3 + 0xe8) != 0x534f4442 ^ 0xffU) & 1;
      }
    }
    if ((mem.pb._7_1_ & 1) == 0) {
      BDOS_CAPS::BDOS_CAPS((BDOS_CAPS *)auStack_60);
      GetBDOSCaps(hdd->total_sectors,(BDOS_CAPS *)auStack_60);
      if ((i != bdc->base_sectors) && (bVar1 = ReadSector(hdd,i,(MEMORY *)local_40), bVar1)) {
        puVar3 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_40);
        bdcLBA.records._0_2_ =
             (CONCAT11(bdcLBA.records._1_1_,*(int *)(puVar3 + 0xe8) != 0x4f534244) ^ 0xff) & 0xff01;
        mem.pb._7_1_ = (*(int *)(puVar3 + 0xe8) != 0x4f534244 ^ 0xffU) & 1;
        if ((bool)mem.pb._7_1_ == false) {
          puVar3 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_40);
          mem.pb._7_1_ = (*(int *)(puVar3 + 0xe8) != 0x534f4442 ^ 0xffU) & 1;
        }
        bdcLBA.records._2_1_ = mem.pb._7_1_;
        if ((bool)mem.pb._7_1_ != false) {
          bdc->list_sectors = (int)auStack_60;
          bdc->base_sectors = i;
          bdc->records = bdcLBA.list_sectors;
          bdc->extra_sectors = bdcLBA.base_sectors;
          bdc->need_byteswap = (bool)(undefined1)bdcLBA.records;
          bdc->bootable = (bool)bdcLBA.records._1_1_;
          bdc->lba = (bool)mem.pb._7_1_;
        }
      }
    }
    if (((mem.pb._7_1_ & 1) == 0) && (bVar1 = ReadSector(hdd,0,(MEMORY *)local_40), bVar1)) {
      for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
        puVar3 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_40);
        puVar3[local_64] = puVar3[local_64] & 0x5f;
        puVar3 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_40);
        puVar3[local_64 + 0x100] = puVar3[local_64 + 0x100] & 0x5f;
      }
      piVar4 = (int *)MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_40);
      bdc->need_byteswap = (bool)((*piVar4 != 0x4f54424f ^ 0xffU) & 1);
      local_b9 = 1;
      if ((bdc->need_byteswap & 1U) == 0) {
        puVar3 = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)local_40);
        local_b9 = *(int *)(puVar3 + 0x100) != 0x544f4f42 ^ 0xff;
      }
      bdc->bootable = (bool)(local_b9 & 1);
      mem.pb._7_1_ = bdc->bootable & 1;
    }
    hdd_local._7_1_ = (bool)(mem.pb._7_1_ & 1);
    MEMORY::~MEMORY((MEMORY *)local_40);
  }
  else {
    hdd_local._7_1_ = false;
  }
  return hdd_local._7_1_;
}

Assistant:

bool IsBDOSDisk(const HDD& hdd, BDOS_CAPS& bdc)
{
    bool f = false;

    // Sector size must be 512 bytes for BDOS
    if (hdd.sector_size != BDOS_SECTOR_SIZE)
        return false;

    MEMORY mem(hdd.sector_size);

    // Determine BDOS parameters from the CHS geometry (as BDOS does)
    GetBDOSCaps(hdd.cyls * hdd.heads * hdd.sectors, bdc);

    // Read the first sector in record 1 to check for a BDOS signature
    if (ReadSector(hdd, bdc.base_sectors, mem))
    {
        f = bdc.need_byteswap = !memcmp(mem + 232, "DBSO", 4);
        if (!f) f = !memcmp(mem + 232, "BDOS", 4);
    }

    // If that didn't work, try record 1 using LBA sector count
    if (!f)
    {
        // Determine the BDOS parameters from the LBA sector count (as Trinity does, and SAMdisk used to)
        BDOS_CAPS bdcLBA;
        GetBDOSCaps(hdd.total_sectors, bdcLBA);

        // Only check the base sector if it differs from the CHS position
        if (bdcLBA.base_sectors != bdc.base_sectors && ReadSector(hdd, bdcLBA.base_sectors, mem))
        {
            f = bdcLBA.need_byteswap = !memcmp(mem + 232, "DBSO", 4);
            if (!f) f = !memcmp(mem + 232, "BDOS", 4);
            bdcLBA.lba = f;

            // If the disk is relying on the LBA sector count, use the new details
            if (f)
                bdc = bdcLBA;
        }
    }

    // If we're still not sure, check for a BDOS boot sector
    if (!f && ReadSector(hdd, 0, mem))
    {
        // Clear bits 7 and 5 (case) for the boot signature check
        for (int i = 0; i < 4; ++i) { mem[i + 0x000] &= ~0xa0; mem[i + 0x100] &= ~0xa0; }

        // Check for the boot sector signatures at the appropriate offsets for Atom and Atom Lite
        bdc.need_byteswap = !memcmp(mem + 0x000, "OBTO", 4);
        bdc.bootable = bdc.need_byteswap || !memcmp(mem + 0x100, "BOOT", 4);
        f = bdc.bootable;
    }

    return f;
}